

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

PHYSFS_EnumerateCallbackResult enumFilesCallback(void *data,char *origdir,char *str)

{
  _func_void_ptr_PHYSFS_uint64 *p_Var1;
  int iVar2;
  void *pvVar3;
  size_t sVar4;
  char *__dest;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar8 = *(uint *)((long)data + 8);
  pvVar3 = *data;
  if (uVar8 == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    uVar5 = uVar8;
    do {
      uVar6 = uVar5 >> 1;
      iVar2 = strcmp(*(char **)((long)pvVar3 + (ulong)(uVar6 + uVar7) * 8),str);
      if (iVar2 == 0) {
        return PHYSFS_ENUM_OK;
      }
      if (iVar2 < 1) {
        uVar7 = uVar6 + uVar7 + 1;
        uVar6 = uVar5 + ~uVar6;
      }
      uVar5 = uVar6;
    } while (uVar5 != 0);
  }
  pvVar3 = (*__PHYSFS_AllocatorHooks.Realloc)(pvVar3,(ulong)(uVar8 + 2) << 3);
  p_Var1 = __PHYSFS_AllocatorHooks.Malloc;
  sVar4 = strlen(str);
  __dest = (char *)(*p_Var1)(sVar4 + 1);
  if (pvVar3 == (void *)0x0) {
    if (__dest != (char *)0x0) {
      (*__PHYSFS_AllocatorHooks.Free)(__dest);
    }
  }
  else {
    *(void **)data = pvVar3;
    if (__dest != (char *)0x0) {
      strcpy(__dest,str);
      uVar5 = *(int *)((long)data + 8) - uVar7;
      uVar8 = uVar7;
      if (uVar5 != 0) {
        memmove((void *)(*data + (ulong)(uVar7 + 1) * 8),(void *)(*data + (ulong)uVar7 * 8),
                (ulong)uVar5 << 3);
        uVar8 = *(uint *)((long)data + 8);
      }
      *(char **)(*data + (ulong)uVar7 * 8) = __dest;
      *(uint *)((long)data + 8) = uVar8 + 1;
      return PHYSFS_ENUM_OK;
    }
  }
  *(undefined4 *)((long)data + 0xc) = 2;
  return PHYSFS_ENUM_ERROR;
}

Assistant:

static PHYSFS_EnumerateCallbackResult enumFilesCallback(void *data,
                                        const char *origdir, const char *str)
{
    PHYSFS_uint32 pos;
    void *ptr;
    char *newstr;
    EnumStringListCallbackData *pecd = (EnumStringListCallbackData *) data;

    /*
     * See if file is in the list already, and if not, insert it in there
     *  alphabetically...
     */
    pos = pecd->size;
    if (locateInStringList(str, pecd->list, &pos))
        return PHYSFS_ENUM_OK;  /* already in the list, but keep going. */

    ptr = allocator.Realloc(pecd->list, (pecd->size + 2) * sizeof (char *));
    newstr = (char *) allocator.Malloc(strlen(str) + 1);
    if (ptr != NULL)
        pecd->list = (char **) ptr;

    if ((ptr == NULL) || (newstr == NULL))
    {
        if (newstr)
            allocator.Free(newstr);

        pecd->errcode = PHYSFS_ERR_OUT_OF_MEMORY;
        return PHYSFS_ENUM_ERROR;  /* better luck next time. */
    } /* if */

    strcpy(newstr, str);

    if (pos != pecd->size)
    {
        memmove(&pecd->list[pos+1], &pecd->list[pos],
                 sizeof (char *) * ((pecd->size) - pos));
    } /* if */

    pecd->list[pos] = newstr;
    pecd->size++;

    return PHYSFS_ENUM_OK;
}